

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Deque.h
# Opt level: O3

void __thiscall
Deque<int,_std::allocator<int>_>::push_back(Deque<int,_std::allocator<int>_> *this,value_type *val)

{
  size_t sVar1;
  DataBlock **ppDVar2;
  DataBlock **ppDVar3;
  value_type *pvVar4;
  pointer piVar5;
  DataBlock *pDVar6;
  DataBlock **ppDVar7;
  size_t sVar8;
  
  sVar1 = (this->current_).size_;
  if (sVar1 == 0) {
    sVar8 = (this->current_).allocSize_;
  }
  else {
    ppDVar2 = (this->current_).arr_;
    sVar8 = (this->current_).allocSize_;
    ppDVar3 = (this->current_).end_;
    ppDVar7 = ppDVar2 + sVar8;
    if (ppDVar3 != ppDVar2) {
      ppDVar7 = ppDVar3;
    }
    if ((ulong)((long)ppDVar7[-1]->end - (long)ppDVar7[-1]->buffer) < 0x400) goto LAB_001261d7;
  }
  if (sVar1 == sVar8) {
    level_up(this);
  }
  piVar5 = (pointer)operator_new(0x400);
  pDVar6 = (DataBlock *)operator_new(0x18);
  pDVar6->buffer = piVar5;
  pDVar6->begin = piVar5;
  pDVar6->end = piVar5;
  sVar1 = (this->current_).size_;
  sVar8 = (this->current_).allocSize_;
  if (sVar1 != sVar8) {
    ppDVar2 = (this->current_).end_;
    (this->current_).end_ = ppDVar2 + 1;
    *ppDVar2 = pDVar6;
    (this->current_).size_ = sVar1 + 1;
    ppDVar2 = (this->current_).arr_;
    if ((long)(this->current_).end_ - (long)ppDVar2 >> 3 == sVar8) {
      (this->current_).end_ = ppDVar2;
    }
  }
  sVar1 = (this->small_).size_;
  sVar8 = (this->small_).allocSize_;
  if (sVar1 != sVar8) {
    ppDVar2 = (this->small_).end_;
    (this->small_).end_ = ppDVar2 + 1;
    *ppDVar2 = pDVar6;
    (this->small_).size_ = sVar1 + 1;
    ppDVar2 = (this->small_).arr_;
    if ((long)(this->small_).end_ - (long)ppDVar2 >> 3 == sVar8) {
      (this->small_).end_ = ppDVar2;
    }
  }
LAB_001261d7:
  overtake(this);
  ppDVar2 = (this->current_).arr_;
  ppDVar3 = (this->current_).end_;
  ppDVar7 = ppDVar2 + (this->current_).allocSize_;
  if (ppDVar3 != ppDVar2) {
    ppDVar7 = ppDVar3;
  }
  pvVar4 = ppDVar7[-1]->end;
  ppDVar7[-1]->end = pvVar4 + 1;
  *pvVar4 = *val;
  return;
}

Assistant:

void push_back(const value_type &val) {
        if (current_.empty() || !current_.back()->can_push_back()) {
            if (current_.full()) {
                level_up();
            }
            pointer ptr = allocator_.allocate(DataBlock::SIZE);
            DataBlock *block = new DataBlock(ptr);
            current_.push_back(block);
            if (!small_.full()) {
                small_.push_back(block);
            }
        }
        overtake();
        allocator_.construct(current_.back()->end++, val);
    }